

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O3

void __thiscall
AlignmentRecord::AlignmentRecord
          (AlignmentRecord *this,BamAlignment *alignment,int readRef,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rnm,string *mainReference)

{
  pointer *ppcVar1;
  _Rb_tree_header *p_Var2;
  uint uVar3;
  pointer pCVar4;
  iterator __position;
  pointer pmVar5;
  char cVar6;
  byte bVar7;
  uint uVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__tmp;
  size_t sVar9;
  int iVar10;
  long lVar11;
  AlignmentRecord *this_00;
  ShortDnaSequence *this_01;
  pointer __args;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *__range1;
  string querySequence;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  ref1;
  int local_1cc;
  vector<int,_std::allocator<int>_> *local_1c8;
  string *local_1c0;
  string *local_1b8;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *local_1b0;
  element_type *local_1a8;
  shared_count asStack_1a0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  set<int,_std::less<int>,_std::allocator<int>_> *local_150;
  ShortDnaSequence *local_148;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  string *local_138;
  string *local_130;
  ShortDnaSequence local_128;
  string local_e0;
  vector<char,_std::allocator<char>_> local_c0;
  string local_a8;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
  local_88;
  
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name)._M_string_length = 0;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_1b0 = &this->cigar1;
  this_01 = &this->sequence1;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1cc = readRef;
  local_130 = mainReference;
  ShortDnaSequence::ShortDnaSequence(this_01);
  local_140 = &(this->al_sequence1).field_2;
  (this->al_sequence1)._M_dataplus._M_p = (pointer)local_140;
  (this->al_sequence1)._M_string_length = 0;
  (this->al_sequence1).field_2._M_local_buf[0] = '\0';
  local_148 = &this->sequence2;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar2).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cigar2_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShortDnaSequence::ShortDnaSequence(local_148);
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_150 = &this->readNames;
  p_Var2 = &(this->readNames)._M_t._M_impl.super__Rb_tree_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (this->readNames)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->readNameMap = rnm;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->consistingReads).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1b8 = (string *)&this->reference_seq1;
  local_158 = &(this->reference_seq1).field_2;
  (this->reference_seq1)._M_dataplus._M_p = (pointer)local_158;
  (this->reference_seq1)._M_string_length = 0;
  (this->reference_seq1).field_2._M_local_buf[0] = '\0';
  local_160 = &(this->reference_seq2).field_2;
  (this->reference_seq2)._M_dataplus._M_p = (pointer)local_160;
  (this->reference_seq2)._M_string_length = 0;
  (this->reference_seq2).field_2._M_local_buf[0] = '\0';
  local_1c0 = (string *)&this->alignSequence1;
  local_168 = &(this->alignSequence1).field_2;
  (this->alignSequence1)._M_dataplus._M_p = (pointer)local_168;
  (this->alignSequence1)._M_string_length = 0;
  (this->alignSequence1).field_2._M_local_buf[0] = '\0';
  local_170 = &(this->alignSequence2).field_2;
  (this->alignSequence2)._M_dataplus._M_p = (pointer)local_170;
  (this->alignSequence2)._M_string_length = 0;
  (this->alignSequence2).field_2._M_local_buf[0] = '\0';
  local_178 = &(this->code1).field_2;
  (this->code1)._M_dataplus._M_p = (pointer)local_178;
  (this->code1)._M_string_length = 0;
  (this->code1).field_2._M_local_buf[0] = '\0';
  local_180 = &(this->code2).field_2;
  (this->code2)._M_dataplus._M_p = (pointer)local_180;
  (this->code2)._M_string_length = 0;
  (this->code2).field_2._M_local_buf[0] = '\0';
  local_188 = &(this->gcQuality1).field_2;
  (this->gcQuality1)._M_dataplus._M_p = (pointer)local_188;
  (this->gcQuality1)._M_string_length = 0;
  (this->gcQuality1).field_2._M_local_buf[0] = '\0';
  local_190 = &(this->gcQuality2).field_2;
  (this->gcQuality2)._M_dataplus._M_p = (pointer)local_190;
  (this->gcQuality2)._M_string_length = 0;
  (this->gcQuality2).field_2._M_local_buf[0] = '\0';
  local_1c8 = &this->qualityList1;
  this->support = 0;
  this->uniqueSupport = 0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  (this->qualityList2).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  (this->qualityList1).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  this->single_end = true;
  std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
  _M_insert_unique<int_const&>
            ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)local_150,
             &local_1cc);
  std::__cxx11::string::_M_assign((string *)this);
  this->start1 = *(int *)(alignment + 0xac) + 1;
  uVar8 = BamTools::BamAlignment::GetEndPosition(SUB81(alignment,0),false);
  this->end1 = uVar8;
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::operator=
            (local_1b0,
             (vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)(alignment + 0xb8));
  this->support = 0;
  this->uniqueSupport = 0;
  local_138 = (string *)(alignment + 0x68);
  if (*(long *)(alignment + 0x70) == 0) {
    iVar10 = 0;
  }
  else {
    lVar11 = 0;
    iVar10 = 0;
    do {
      iVar10 = iVar10 + (local_138->_M_dataplus)._M_p[lVar11] + -0x21;
      lVar11 = lVar11 + 1;
    } while (*(long *)(alignment + 0x70) != lVar11);
  }
  this->phred_sum1 = iVar10;
  pCVar4 = (this->cigar1).super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (__args = (this->cigar1).
                super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>._M_impl.
                super__Vector_impl_data._M_start; __args != pCVar4; __args = __args + 1) {
    if (__args->Length != 0) {
      uVar8 = 0;
      do {
        __position._M_current =
             (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                    ((vector<char,std::allocator<char>> *)&this->cigar1_unrolled,__position,
                     &__args->Type);
        }
        else {
          *__position._M_current = __args->Type;
          ppcVar1 = &(this->cigar1_unrolled).super__Vector_base<char,_std::allocator<char>_>._M_impl
                     .super__Vector_impl_data._M_finish;
          *ppcVar1 = *ppcVar1 + 1;
        }
        uVar8 = uVar8 + 1;
        uVar3 = __args->Length;
      } while (uVar8 < uVar3);
      if ((__args->Type == 'D') &&
         (this->length_incl_deletions1 = this->length_incl_deletions1 + uVar3, 1 < uVar3)) {
        this->length_incl_longdeletions1 = this->length_incl_longdeletions1 + uVar3;
      }
    }
  }
  cVar6 = BamTools::BamAlignment::IsPaired();
  if (cVar6 == '\0') {
    bVar7 = BamTools::BamAlignment::IsReverseStrand();
    this->strand1 = (bool)(bVar7 ^ 1);
    goto LAB_00164d79;
  }
  cVar6 = BamTools::BamAlignment::IsFirstMate();
  if (cVar6 == '\0') {
    cVar6 = BamTools::BamAlignment::IsSecondMate();
    if (cVar6 == '\0') goto LAB_00164d79;
    cVar6 = BamTools::BamAlignment::IsReverseStrand();
    if (cVar6 != '\0') goto LAB_00164d72;
  }
  else {
    cVar6 = BamTools::BamAlignment::IsReverseStrand();
    if (cVar6 == '\0') {
LAB_00164d72:
      this->strand1 = true;
      goto LAB_00164d79;
    }
  }
  this->strand1 = false;
LAB_00164d79:
  this->refId = *(int *)(alignment + 0xa8);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_e0,*(long *)(alignment + 0x28),
             *(long *)(alignment + 0x30) + *(long *)(alignment + 0x28));
  std::vector<char,_std::allocator<char>_>::vector(&local_c0,&this->cigar1_unrolled);
  iVar10 = *(int *)(alignment + 0xac);
  this_00 = *(AlignmentRecord **)(alignment + 0x68);
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,this_00,
             (long)&(this_00->name)._M_dataplus._M_p + *(long *)(alignment + 0x70));
  referenceString(&local_88,this_00,&local_c0,iVar10,&local_e0,&local_a8,local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  if (local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ShortDnaSequence::ShortDnaSequence(&local_128,&local_e0,local_138);
  if ((pointer)local_128.forward.pn.pi_ != (pointer)0x0) {
    LOCK();
    (local_128.forward.pn.pi_)->use_count_ = (local_128.forward.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_1a8 = (this->sequence1).forward.px;
  asStack_1a0[0].pi_ = (this->sequence1).forward.pn.pi_;
  (this->sequence1).forward.px = local_128.forward.px;
  (this->sequence1).forward.pn.pi_ = local_128.forward.pn.pi_;
  boost::detail::shared_count::~shared_count(asStack_1a0);
  if (local_128.forward_qualities.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_128.forward_qualities.pn.pi_)->use_count_ =
         (local_128.forward_qualities.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_1a8 = (this->sequence1).forward_qualities.px;
  asStack_1a0[0].pi_ = (this->sequence1).forward_qualities.pn.pi_;
  (this->sequence1).forward_qualities.px = local_128.forward_qualities.px;
  (this->sequence1).forward_qualities.pn.pi_ = local_128.forward_qualities.pn.pi_;
  boost::detail::shared_count::~shared_count(asStack_1a0);
  if (local_128.backward.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_128.backward.pn.pi_)->use_count_ = (local_128.backward.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_1a8 = (this->sequence1).backward.px;
  asStack_1a0[0].pi_ = (this->sequence1).backward.pn.pi_;
  (this->sequence1).backward.px = local_128.backward.px;
  (this->sequence1).backward.pn.pi_ = local_128.backward.pn.pi_;
  boost::detail::shared_count::~shared_count(asStack_1a0);
  if (local_128.backward_qualities.pn.pi_ != (sp_counted_base *)0x0) {
    LOCK();
    (local_128.backward_qualities.pn.pi_)->use_count_ =
         (local_128.backward_qualities.pn.pi_)->use_count_ + 1;
    UNLOCK();
  }
  local_1a8 = (this->sequence1).backward_qualities.px;
  asStack_1a0[0].pi_ = (this->sequence1).backward_qualities.pn.pi_;
  (this->sequence1).backward_qualities.px = local_128.backward_qualities.px;
  (this->sequence1).backward_qualities.pn.pi_ = local_128.backward_qualities.pn.pi_;
  boost::detail::shared_count::~shared_count(asStack_1a0);
  ShortDnaSequence::~ShortDnaSequence(&local_128);
  std::__cxx11::string::_M_assign(local_1b8);
  std::__cxx11::string::_M_assign(local_1c0);
  std::vector<int,_std::allocator<int>_>::operator=
            (local_1c8,(vector<int,_std::allocator<int>_> *)&local_88);
  sVar9 = ShortDnaSequence::size(this_01);
  this->length_incl_deletions1 = (int)sVar9;
  sVar9 = ShortDnaSequence::size(this_01);
  this->length_incl_longdeletions1 = (int)sVar9;
  coveredPositions((vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *)
                   &local_128,this);
  pmVar5 = (this->cov_pos).
           super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)local_128._vptr_ShortDnaSequence;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)local_128.forward.px;
  (this->cov_pos).
  super__Vector_base<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_128.forward.pn.pi_;
  local_128._vptr_ShortDnaSequence = (_func_int **)0x0;
  local_128.forward.px = (element_type *)0x0;
  local_128.forward.pn.pi_ = (sp_counted_base *)0x0;
  if ((pmVar5 != (pointer)0x0) &&
     (operator_delete(pmVar5), local_128._vptr_ShortDnaSequence != (_func_int **)0x0)) {
    operator_delete(local_128._vptr_ShortDnaSequence);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_88.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_88.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
         .
         super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_dataplus._M_p !=
      &local_88.
       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
       .
       super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
       ._M_head_impl.field_2) {
    operator_delete(local_88.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl._M_dataplus._M_p);
  }
  if (local_88.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .
      super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
      .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
      super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>._M_head_impl.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(local_88.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .
                    super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>
                    .super__Tuple_impl<2UL,_std::vector<int,_std::allocator<int>_>_>.
                    super__Head_base<2UL,_std::vector<int,_std::allocator<int>_>,_false>.
                    _M_head_impl.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p);
  }
  return;
}

Assistant:

AlignmentRecord::AlignmentRecord(const BamTools::BamAlignment& alignment, int readRef, vector<string>* rnm , string &mainReference) : readNameMap(rnm) {

    this->single_end = true;
    this->readNames.insert(readRef);
    this->name = alignment.Name;
    this->start1 = alignment.Position + 1;
    this->end1 = alignment.GetEndPosition();
    this->cigar1 = alignment.CigarData;
    this->uniqueSupport = 0;
    this->support = 0;

    this->phred_sum1 = phred_sum(alignment.Qualities);
    //Constructing the unrolled cigar strings
    for (const auto& it : cigar1) {
        for (unsigned int s = 0; s < it.Length; ++s) {
            this->cigar1_unrolled.push_back(it.Type);
        }
        if (it.Type == 'D') {
            this->length_incl_deletions1+=it.Length;
            if (it.Length > 1) {
                this->length_incl_longdeletions1+=it.Length;
            }
        }
    }

    //NoMe Additions
    //Determines if the alignment is forward or reverse stranded
    if(!alignment.IsPaired()){
    this->strand1 = !alignment.IsReverseStrand();
    }else{
        if(alignment.IsFirstMate()){
            if(!alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }else if(alignment.IsSecondMate()){
            if(alignment.IsReverseStrand()){
                this->strand1=true;
            }else{
                this->strand1=false;
            }
        }
    }
    this->refId=alignment.RefID;
    string querySequence = alignment.QueryBases;
    //Reference string returns the reference, the aligned sequence and the quality list
    auto ref1 = referenceString(this->getCigar1Unrolled(),alignment.Position,querySequence,alignment.Qualities,mainReference);
    this->sequence1 = ShortDnaSequence(querySequence, alignment.Qualities);

    this->reference_seq1 = std::get<0>(ref1);
    this->alignSequence1=std::get<1>(ref1);
    this->qualityList1 = std::get<2>(ref1);
    this->length_incl_deletions1 = this->sequence1.size();
    this->length_incl_longdeletions1 = this->sequence1.size();

    //End Nome additions



    this->cov_pos = this->coveredPositions();
}